

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable.cpp
# Opt level: O2

SearchEntry * __thiscall
HPack::FieldLookupTable::frontKey(SearchEntry *__return_storage_ptr__,FieldLookupTable *this)

{
  quint32 qVar1;
  vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *pvVar2;
  HeaderField *pHVar3;
  const_reference pvVar4;
  
  pHVar3 = front(this);
  pvVar4 = std::
           deque<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
           ::front(&this->chunks);
  pvVar2 = (pvVar4->_M_t).
           super___uniq_ptr_impl<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_*,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>
           .
           super__Head_base<0UL,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_*,_false>
           ._M_head_impl;
  qVar1 = this->begin;
  __return_storage_ptr__->field = pHVar3;
  __return_storage_ptr__->chunk = pvVar2;
  __return_storage_ptr__->offset = qVar1;
  __return_storage_ptr__->table = this;
  return __return_storage_ptr__;
}

Assistant:

FieldLookupTable::SearchEntry FieldLookupTable::frontKey() const
{
    Q_ASSERT(chunks.size() && end != begin);
    return SearchEntry(&front(), chunks.front().get(), begin, this);
}